

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.cpp
# Opt level: O1

quint32 __thiscall
HPack::HuffmanDecoder::addTable(HuffmanDecoder *this,quint32 prefix,quint32 index)

{
  pointer *ppPVar1;
  iterator __position;
  long in_FS_OFFSET;
  PrefixTable newTable;
  PrefixTable local_24;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_24.offset =
       (int)((ulong)((long)(this->tableData).
                           super__Vector_base<HPack::PrefixTableEntry,_std::allocator<HPack::PrefixTableEntry>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->tableData).
                          super__Vector_base<HPack::PrefixTableEntry,_std::allocator<HPack::PrefixTableEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
  __position._M_current =
       (this->prefixTables).
       super__Vector_base<HPack::PrefixTable,_std::allocator<HPack::PrefixTable>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_24.prefixLength = prefix;
  local_24.indexLength = index;
  if (__position._M_current ==
      (this->prefixTables).
      super__Vector_base<HPack::PrefixTable,_std::allocator<HPack::PrefixTable>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<HPack::PrefixTable,std::allocator<HPack::PrefixTable>>::
    _M_realloc_insert<HPack::PrefixTable_const&>
              ((vector<HPack::PrefixTable,std::allocator<HPack::PrefixTable>> *)this,__position,
               &local_24);
  }
  else {
    (__position._M_current)->offset = local_24.offset;
    (__position._M_current)->prefixLength = prefix;
    (__position._M_current)->indexLength = index;
    ppPVar1 = &(this->prefixTables).
               super__Vector_base<HPack::PrefixTable,_std::allocator<HPack::PrefixTable>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppPVar1 = *ppPVar1 + 1;
  }
  std::vector<HPack::PrefixTableEntry,_std::allocator<HPack::PrefixTableEntry>_>::resize
            (&this->tableData,
             (1L << ((byte)local_24.indexLength & 0x3f)) +
             ((long)(this->tableData).
                    super__Vector_base<HPack::PrefixTableEntry,_std::allocator<HPack::PrefixTableEntry>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->tableData).
                    super__Vector_base<HPack::PrefixTableEntry,_std::allocator<HPack::PrefixTableEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (int)((ulong)((long)(this->prefixTables).
                               super__Vector_base<HPack::PrefixTable,_std::allocator<HPack::PrefixTable>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->prefixTables).
                              super__Vector_base<HPack::PrefixTable,_std::allocator<HPack::PrefixTable>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555 - 1;
  }
  __stack_chk_fail();
}

Assistant:

quint32 HuffmanDecoder::addTable(quint32 prefix, quint32 index)
{
    PrefixTable newTable{prefix, index};
    newTable.offset = quint32(tableData.size());
    prefixTables.push_back(newTable);
    // Add entries for this table:
    tableData.resize(tableData.size() + newTable.size());

    return quint32(prefixTables.size() - 1);
}